

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

double __thiscall arangodb::velocypack::Parser::scanDigitsFractional(Parser *this)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  
  uVar2 = this->_pos;
  dVar4 = 0.0;
  dVar5 = 0.1;
  do {
    uVar3 = 0xffffffff;
    if (uVar2 < this->_size) {
      this->_pos = uVar2 + 1;
      uVar3 = (uint)this->_start[uVar2];
      uVar2 = uVar2 + 1;
    }
    if ((int)uVar3 < 0) {
LAB_00113584:
      bVar1 = false;
      in_XMM0_Qa = dVar4;
    }
    else {
      if (uVar3 - 0x3a < 0xfffffff6) {
        uVar2 = uVar2 - 1;
        this->_pos = uVar2;
        goto LAB_00113584;
      }
      dVar4 = dVar4 + (double)(int)(uVar3 - 0x30) * dVar5;
      dVar5 = dVar5 / 10.0;
      bVar1 = true;
    }
    if (!bVar1) {
      return in_XMM0_Qa;
    }
  } while( true );
}

Assistant:

double scanDigitsFractional() {
    double pot = 0.1;
    double x = 0.0;
    while (true) {
      int i = consume();
      if (i < 0) {
        return x;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return x;
      }
      x = x + pot * (i - '0');
      pot /= 10.0;
    }
  }